

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLin>
               (GetterYs<unsigned_char> *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  int iVar6;
  int iVar7;
  ImPlotContext *gp;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_70;
  float local_64;
  TransformerLinLin *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar6 = getter->Count;
    local_48 = iVar6 + -1;
    iVar7 = transformer->YAxis;
    local_3c.x = (float)(((getter->XScale * 0.0 + getter->X0) - (pIVar4->XAxis).Range.Min) *
                         GImPlot->Mx + (double)GImPlot->PixelRange[iVar7].Min.x);
    local_3c.y = (float)(((double)getter->Ys
                                  [(long)((getter->Offset % iVar6 + iVar6) % iVar6) *
                                   (long)getter->Stride] - pIVar4->YAxis[iVar7].Range.Min) *
                         GImPlot->My[iVar7] + (double)GImPlot->PixelRange[iVar7].Min.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLin> *)
               local_58,DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar6 = getter->Count;
    iVar7 = transformer->YAxis;
    local_58._0_4_ =
         (undefined4)
         (((getter->XScale * 0.0 + getter->X0) - (pIVar4->XAxis).Range.Min) * GImPlot->Mx +
         (double)GImPlot->PixelRange[iVar7].Min.x);
    local_58._4_4_ =
         (undefined4)
         (((double)getter->Ys
                   [(long)((getter->Offset % iVar6 + iVar6) % iVar6) * (long)getter->Stride] -
          pIVar4->YAxis[iVar7].Range.Min) * GImPlot->My[iVar7] +
         (double)GImPlot->PixelRange[iVar7].Min.y);
    iVar6 = getter->Count;
    if (1 < iVar6) {
      iVar7 = 1;
      local_64 = line_weight;
      local_60 = transformer;
      do {
        iVar3 = transformer->YAxis;
        local_70.x = (float)((((double)iVar7 * getter->XScale + getter->X0) -
                             (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[iVar3].Min.x);
        local_70.y = (float)(((double)getter->Ys
                                      [(long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) *
                                       (long)getter->Stride] -
                             GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) * GImPlot->My[iVar3] +
                            (double)GImPlot->PixelRange[iVar3].Min.y);
        pIVar4 = pIVar5->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (local_70.y <= (float)local_58._4_4_) {
          fVar2 = local_70.y;
        }
        if ((fVar2 < (pIVar4->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(local_70.y <= (float)local_58._4_4_) & (uint)local_70.y |
                           local_58._4_4_ & -(uint)(local_70.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar2 = local_70.x;
          }
          if ((fVar2 < (pIVar4->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar4->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_70,col,line_weight);
            transformer = local_60;
            line_weight = local_64;
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar7 = iVar7 + 1;
        iVar6 = getter->Count;
      } while (iVar7 < iVar6);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}